

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O2

FT_Error afm_parser_read_int(AFM_Parser parser,FT_Int *aint)

{
  FT_Int FVar1;
  FT_Error FVar2;
  undefined1 local_20 [8];
  AFM_ValueRec val;
  
  local_20._0_4_ = AFM_VALUE_TYPE_INTEGER;
  FVar1 = afm_parser_read_vals(parser,(AFM_Value)local_20,1);
  FVar2 = 0xa0;
  if (FVar1 == 1) {
    *aint = val.type;
    FVar2 = 0;
  }
  return FVar2;
}

Assistant:

static FT_Error
  afm_parser_read_int( AFM_Parser  parser,
                       FT_Int*     aint )
  {
    AFM_ValueRec  val;


    val.type = AFM_VALUE_TYPE_INTEGER;

    if ( afm_parser_read_vals( parser, &val, 1 ) == 1 )
    {
      *aint = val.u.i;

      return FT_Err_Ok;
    }
    else
      return FT_THROW( Syntax_Error );
  }